

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

void __thiscall
QItemDelegate::drawBackground
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index)

{
  ColorRole CVar1;
  bool bVar2;
  ColorRole CVar3;
  undefined8 uVar4;
  ColorRole CVar5;
  long in_FS_OFFSET;
  QPoint local_60;
  double local_58;
  double local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((option->showDecorationSelected == true) &&
     (CVar1 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i, (short)CVar1 < 0)) {
    CVar3 = Light;
    if ((CVar1 >> 0x10 & 1) != 0) {
      CVar3 = CVar1 & Button ^ Button;
    }
    CVar5 = Button;
    if ((CVar1 & Button) != WindowText) {
      CVar5 = CVar3;
    }
    QPalette::brush((int)option + 0x28,CVar5);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QPainter::fillRect((QRect *)painter,(QBrush *)&(option->super_QStyleOption).rect);
      return;
    }
  }
  else {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::data((QVariant *)&local_48,index,8);
    bVar2 = ::QVariant::canConvert<QBrush>((QVariant *)&local_48);
    if (bVar2) {
      uVar4 = QPainter::brushOrigin();
      local_58 = (double)(int)uVar4;
      local_50 = (double)(int)((ulong)uVar4 >> 0x20);
      local_60.xp.m_i = (option->super_QStyleOption).rect.x1.m_i;
      local_60.yp.m_i = (option->super_QStyleOption).rect.y1.m_i;
      QPainter::setBrushOrigin(painter,&local_60);
      qvariant_cast<QBrush>((QVariant *)&local_60);
      QPainter::fillRect((QRect *)painter,(QBrush *)&(option->super_QStyleOption).rect);
      QBrush::~QBrush((QBrush *)&local_60);
      QPainter::setBrushOrigin((QPointF *)painter);
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawBackground(QPainter *painter,
                                   const QStyleOptionViewItem &option,
                                   const QModelIndex &index) const
{
    if (option.showDecorationSelected && (option.state & QStyle::State_Selected)) {
        QPalette::ColorGroup cg = option.state & QStyle::State_Enabled
                                  ? QPalette::Normal : QPalette::Disabled;
        if (cg == QPalette::Normal && !(option.state & QStyle::State_Active))
            cg = QPalette::Inactive;

        painter->fillRect(option.rect, option.palette.brush(cg, QPalette::Highlight));
    } else {
        QVariant value = index.data(Qt::BackgroundRole);
        if (value.canConvert<QBrush>()) {
            QPointF oldBO = painter->brushOrigin();
            painter->setBrushOrigin(option.rect.topLeft());
            painter->fillRect(option.rect, qvariant_cast<QBrush>(value));
            painter->setBrushOrigin(oldBO);
        }
    }
}